

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O1

int __thiscall
Centaurus::DFA<unsigned_char>::add_state
          (DFA<unsigned_char> *this,set<int,_std::less<int>,_std::allocator<int>_> *label,
          bool long_flag)

{
  _Rb_tree_header *p_Var1;
  pointer pDVar2;
  NFABase<Centaurus::DFAState<unsigned_char>_> *pNVar3;
  DFA<unsigned_char> *pDVar4;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  undefined7 in_register_00000011;
  _Rb_tree_color *p_Var7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool local_82;
  allocator_type local_81;
  _Rb_tree_node_base *local_80;
  undefined4 local_74;
  set<int,_std::less<int>,_std::allocator<int>_> *local_70;
  DFA<unsigned_char> *local_68;
  ulong local_60;
  size_t local_58;
  undefined1 local_50 [8];
  pointer local_48;
  
  local_74 = (undefined4)CONCAT71(in_register_00000011,long_flag);
  pDVar2 = (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
           super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2;
  bVar9 = lVar5 != 0;
  local_82 = long_flag;
  local_70 = label;
  local_68 = this;
  if (bVar9) {
    local_60 = (lVar5 >> 3) * -0x71c71c71c71c71c7;
    local_80 = (label->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_58 = (label->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    p_Var1 = &(label->_M_t)._M_impl.super__Rb_tree_header;
    bVar10 = (_Rb_tree_header *)local_80 == p_Var1;
    uVar8 = 0;
    do {
      p_Var7 = *(_Rb_tree_color **)
                &pDVar2[uVar8].super_NFABaseState<unsigned_char,_Centaurus::IndexVector>.m_label.
                 super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data;
      if (local_58 ==
          (long)*(pointer *)
                 ((long)&pDVar2[uVar8].super_NFABaseState<unsigned_char,_Centaurus::IndexVector>.
                         m_label.super_vector<int,_std::allocator<int>_> + 8) - (long)p_Var7 >> 2) {
        bVar11 = bVar10;
        if ((_Rb_tree_header *)local_80 == p_Var1) {
LAB_00135148:
          if (bVar11) {
            pDVar2[uVar8].m_long = (bool)(pDVar2[uVar8].m_long | (byte)local_74);
            if (bVar9) goto LAB_001351c9;
            break;
          }
        }
        else {
          p_Var6 = local_80;
          if (local_80[1]._M_color == *p_Var7) {
            do {
              p_Var7 = p_Var7 + 1;
              p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
              bVar11 = (_Rb_tree_header *)p_Var6 == p_Var1;
              if (bVar11) goto LAB_00135148;
            } while (p_Var6[1]._M_color == *p_Var7);
          }
        }
      }
      uVar8 = (ulong)((int)uVar8 + 1);
      bVar9 = uVar8 < local_60;
    } while (uVar8 < local_60);
  }
  pDVar4 = local_68;
  pNVar3 = &local_68->super_NFABase<Centaurus::DFAState<unsigned_char>_>;
  std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
            ((vector<int,std::allocator<int>> *)&local_48,
             (local_70->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<int>)&(local_70->_M_t)._M_impl.super__Rb_tree_header,&local_81
            );
  local_50 = (undefined1  [8])&PTR__IndexVector_0019ff08;
  std::vector<Centaurus::DFAState<unsigned_char>,std::allocator<Centaurus::DFAState<unsigned_char>>>
  ::emplace_back<Centaurus::IndexVector,bool&>
            ((vector<Centaurus::DFAState<unsigned_char>,std::allocator<Centaurus::DFAState<unsigned_char>>>
              *)&pNVar3->m_states,(IndexVector *)local_50,&local_82);
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48);
  }
  uVar8 = (ulong)((int)((ulong)((long)(pDVar4->super_NFABase<Centaurus::DFAState<unsigned_char>_>).
                                      m_states.
                                      super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pDVar4->super_NFABase<Centaurus::DFAState<unsigned_char>_>).
                                     m_states.
                                     super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39 -
                 1);
LAB_001351c9:
  return (int)uVar8;
}

Assistant:

int add_state(const std::set<int>& label, bool long_flag = false)
	{
		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			if (label.size() == m_states[i].label().size() && std::equal(label.cbegin(), label.cend(), m_states[i].label().cbegin()))
			{
                m_states[i].set_long(long_flag);
				return i;
			}
		}
		m_states.emplace_back(IndexVector(label.cbegin(), label.cend()), long_flag);
		return m_states.size() - 1;
	}